

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall Lib::Stack<unsigned_int>::Stack(Stack<unsigned_int> *this,size_t initialCapacity)

{
  uint *puVar1;
  size_t sVar2;
  
  this->_capacity = initialCapacity;
  if (initialCapacity == 0) {
    sVar2 = 0;
    puVar1 = (uint *)0x0;
  }
  else {
    puVar1 = (uint *)Lib::alloc(initialCapacity << 2);
    sVar2 = this->_capacity;
  }
  this->_stack = puVar1;
  this->_cursor = puVar1;
  this->_end = puVar1 + sVar2;
  return;
}

Assistant:

inline
  explicit Stack (size_t initialCapacity=0)
    : _capacity(initialCapacity)
  {
    if(_capacity) {
      void* mem = ALLOC_KNOWN(_capacity*sizeof(C),className());
      _stack = static_cast<C*>(mem);
    }
    else {
      _stack = nullptr;
    }
    _cursor = _stack;
    _end = _stack+_capacity;
  }